

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall FIX::SessionID::~SessionID(SessionID *this)

{
  SessionID *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_frozenString);
  std::__cxx11::string::~string((string *)&this->m_sessionQualifier);
  TargetCompID::~TargetCompID(&this->m_targetCompID);
  SenderCompID::~SenderCompID(&this->m_senderCompID);
  BeginString::~BeginString(&this->m_beginString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }